

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManSupportsInverse(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  undefined8 *puVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  size_t __size;
  long lVar9;
  long lVar10;
  int iVar11;
  
  __ptr = Aig_ManSupports(p);
  iVar8 = p->nObjs[2];
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar11 = 8;
  if (6 < iVar8 - 1U) {
    iVar11 = iVar8;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar11;
  uVar7 = 0;
  if (iVar11 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar11 << 3);
  }
  pVVar2->pArray = ppvVar3;
  if (0 < iVar8) {
    __size = 0;
    iVar8 = 0;
    uVar7 = 0;
    do {
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0x10;
      pvVar5 = malloc(0x40);
      puVar4[1] = pvVar5;
      if ((int)uVar7 == iVar11) {
        ppvVar3 = pVVar2->pArray;
        if (uVar7 < 0x10) {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,0x80);
          }
          pVVar2->pArray = ppvVar3;
          iVar11 = 0x10;
        }
        else {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(__size);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,__size);
          }
          pVVar2->pArray = ppvVar3;
          iVar11 = iVar8;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      ppvVar3[uVar7] = puVar4;
      uVar7 = uVar7 + 1;
      iVar8 = iVar8 + 2;
      __size = __size + 0x10;
    } while ((int)uVar7 < p->nObjs[2]);
    pVVar2->nSize = (int)uVar7;
    pVVar2->nCap = iVar11;
  }
  iVar8 = __ptr->nSize;
  lVar6 = (long)iVar8;
  if (lVar6 < 1) {
LAB_0060b2c5:
    ppvVar3 = __ptr->pArray;
    if (ppvVar3 == (void **)0x0) goto LAB_0060b2d6;
  }
  else {
    ppvVar3 = __ptr->pArray;
    lVar9 = 0;
    do {
      pvVar5 = ppvVar3[lVar9];
      iVar11 = *(int *)((long)pvVar5 + 4);
      if (iVar11 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x396,"int Vec_IntPop(Vec_Int_t *)");
      }
      *(uint *)((long)pvVar5 + 4) = iVar11 - 1U;
      if (iVar11 != 1) {
        iVar11 = *(int *)(*(long *)((long)pvVar5 + 8) + (ulong)(iVar11 - 1U) * 4);
        lVar10 = 0;
        do {
          iVar1 = *(int *)(*(long *)((long)pvVar5 + 8) + lVar10 * 4);
          if (((long)iVar1 < 0) || ((int)uVar7 <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Vec_IntPush((Vec_Int_t *)pVVar2->pArray[iVar1],iVar11);
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar5 + 4));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != lVar6);
    if (iVar8 < 1) goto LAB_0060b2c5;
    ppvVar3 = __ptr->pArray;
    lVar9 = 0;
    do {
      pvVar5 = ppvVar3[lVar9];
      if (pvVar5 != (void *)0x0) {
        if (*(void **)((long)pvVar5 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar5 + 8));
        }
        free(pvVar5);
      }
      lVar9 = lVar9 + 1;
    } while (lVar6 != lVar9);
  }
  free(ppvVar3);
LAB_0060b2d6:
  free(__ptr);
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsInverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupps, * vSuppsInv;
    Vec_Int_t * vSupp;
    int i, k, iIn, iOut;
    // get structural supports for each output
    vSupps = Aig_ManSupports( p );
    // start the inverse supports
    vSuppsInv = Vec_PtrAlloc( Aig_ManCiNum(p) );
    for ( i = 0; i < Aig_ManCiNum(p); i++ )
        Vec_PtrPush( vSuppsInv, Vec_IntAlloc(8) );
    // transforms the supports into the inverse supports
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vSupp, i )
    {
        iOut = Vec_IntPop( vSupp );
        Vec_IntForEachEntry( vSupp, iIn, k )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vSuppsInv, iIn), iOut );
    }
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    return vSuppsInv;
}